

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unifiedcache.cpp
# Opt level: O0

UnifiedCache * icu_63::UnifiedCache::getInstance(UErrorCode *status)

{
  UBool UVar1;
  UErrorCode *status_local;
  
  umtx_initOnce(&gCacheInitOnce,cacheInit,status);
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    status_local = (UErrorCode *)gCache;
  }
  else {
    status_local = (UErrorCode *)0x0;
  }
  return (UnifiedCache *)status_local;
}

Assistant:

UnifiedCache *UnifiedCache::getInstance(UErrorCode &status) {
    umtx_initOnce(gCacheInitOnce, &cacheInit, status);
    if (U_FAILURE(status)) {
        return NULL;
    }
    U_ASSERT(gCache != NULL);
    return gCache;
}